

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall nite::Batch::unload(Batch *this)

{
  pointer *pppBVar1;
  int iVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  pointer pBVar5;
  long lVar6;
  uint uVar7;
  pointer __src;
  ulong uVar8;
  
  clearBuffer(this);
  pBVar5 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)this->objectId;
  if ((-1 < lVar6) &&
     (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    ppBVar3 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6].owners.
              super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar4 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6].owners.
              super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppBVar4 - (long)ppBVar3 != 0) {
      uVar7 = 1;
      uVar8 = 0;
      do {
        if (ppBVar3[uVar8] == this) {
          __src = ppBVar3 + uVar8 + 1;
          if (__src != ppBVar4) {
            memmove(ppBVar3 + uVar8,__src,(long)ppBVar4 - (long)__src);
          }
          pppBVar1 = &pBVar5[lVar6].owners.
                      super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + -1;
          break;
        }
        uVar8 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar8 < (ulong)((long)ppBVar4 - (long)ppBVar3 >> 3));
    }
    iVar2 = this->objectId;
    if (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      BatchT::clear(batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar2);
    }
    this->objectId = -1;
  }
  return;
}

Assistant:

void nite::Batch::unload(){	
	clearBuffer();	
	if (objectId <= -1 || batches.size() == 0) return;
	for(unsigned i=0; i<batches[objectId].owners.size(); i++){
		if (batches[objectId].owners[i] == this){
			batches[objectId].owners.erase(batches[objectId].owners.begin()+i);
			break;
		}
	}
	if (batches[objectId].owners.size() == 0){
		batches[objectId].clear();
	}
  	objectId = -1;	
}